

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O2

vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *
SetupDummyInputs(vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                 *__return_storage_ptr__,FillableSigningProvider *keystoreRet,
                CCoinsViewCache *coinsRet,array<long,_4UL> *nValues)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  CScript *pCVar4;
  int i;
  CKey *this;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  undefined1 local_170 [68];
  PKHash local_12c;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_118;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  CKey key [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::resize
            (__return_storage_ptr__,2);
  lVar3 = 0;
  do {
    (&key[0].fCompressed)[lVar3] = false;
    *(undefined8 *)
     ((long)&key[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + lVar3)
         = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  this = key;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    CKey::MakeNewKey(this,(bool)((byte)lVar3 & 1));
    (*(keystoreRet->super_SigningProvider)._vptr_SigningProvider[0xb])(keystoreRet,this);
    this = this + 1;
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&((__return_storage_ptr__->
               super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
               _M_impl.super__Vector_impl_data._M_start)->vout,2);
  plVar2 = *(long **)&(((__return_storage_ptr__->
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        )._M_impl.super__Vector_impl_data._M_start)->vout).
                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data;
  *plVar2 = nValues->_M_elems[0];
  CKey::GetPubKey((CPubKey *)&local_f8._M_first,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
             (CPubKey *)&local_f8._M_first);
  b._M_extent._M_extent_value = local_170._8_8_ - local_170._0_8_;
  b._M_ptr = (pointer)local_170._0_8_;
  pCVar4 = CScript::operator<<((CScript *)(plVar2 + 1),b);
  CScript::operator<<(pCVar4,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  lVar3 = *(long *)&(((__return_storage_ptr__->
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)
                      ._M_impl.super__Vector_impl_data._M_start)->vout).
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data;
  *(long *)(lVar3 + 0x28) = nValues->_M_elems[1];
  CKey::GetPubKey((CPubKey *)&local_f8._M_first,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
             (CPubKey *)&local_f8._M_first);
  b_00._M_extent._M_extent_value = local_170._8_8_ - local_170._0_8_;
  b_00._M_ptr = (pointer)local_170._0_8_;
  pCVar4 = CScript::operator<<((CScript *)(lVar3 + 0x30),b_00);
  CScript::operator<<(pCVar4,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  CTransaction::CTransaction
            ((CTransaction *)&local_f8._M_first,
             (__return_storage_ptr__->
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
             super__Vector_impl_data._M_start);
  AddCoins(coinsRet,(CTransaction *)&local_f8._M_first,0,false);
  CTransaction::~CTransaction((CTransaction *)&local_f8._M_first);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&(__return_storage_ptr__->
              super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl
              .super__Vector_impl_data._M_start[1].vout,2);
  **(long **)&(__return_storage_ptr__->
              super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl
              .super__Vector_impl_data._M_start[1].vout.
              super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data =
       nValues->_M_elems[2];
  CKey::GetPubKey((CPubKey *)local_170,key + 2);
  PKHash::PKHash(&local_12c,(CPubKey *)local_170);
  local_f8._M_first._M_storage._M_storage[0x10] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
  local_f8._M_first._M_storage._M_storage[0x11] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
  local_f8._M_first._M_storage._M_storage[0x12] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
  local_f8._M_first._M_storage._M_storage[0x13] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
  local_f8._M_first._M_storage._M_storage[0] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
  local_f8._M_first._M_storage._M_storage[1] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
  local_f8._M_first._M_storage._M_storage[2] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
  local_f8._M_first._M_storage._M_storage[3] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
  local_f8._M_first._M_storage._M_storage[4] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
  local_f8._M_first._M_storage._M_storage[5] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
  local_f8._M_first._M_storage._M_storage[6] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
  local_f8._M_first._M_storage._M_storage[7] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
  local_f8._M_first._M_storage._M_storage[8] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
  local_f8._M_first._M_storage._M_storage[9] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
  local_f8._M_first._M_storage._M_storage[10] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
  local_f8._M_first._M_storage._M_storage[0xb] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
  local_f8._M_first._M_storage._M_storage[0xc] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
  local_f8._M_first._M_storage._M_storage[0xd] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
  local_f8._M_first._M_storage._M_storage[0xe] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
  local_f8._M_first._M_storage._M_storage[0xf] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
  local_b0 = 2;
  GetScriptForDestination((CScript *)&local_118,(CTxDestination *)&local_f8._M_first);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (*(long *)&(__return_storage_ptr__->
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        )._M_impl.super__Vector_impl_data._M_start[1].vout.
                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data + 8),&local_118);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_118);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_f8._M_first);
  *(long *)(*(long *)&(__return_storage_ptr__->
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)
                      ._M_impl.super__Vector_impl_data._M_start[1].vout.
                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data + 0x28) = nValues->_M_elems[3];
  CKey::GetPubKey((CPubKey *)local_170,key + 3);
  PKHash::PKHash(&local_12c,(CPubKey *)local_170);
  local_f8._M_first._M_storage._M_storage[0x10] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
  local_f8._M_first._M_storage._M_storage[0x11] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
  local_f8._M_first._M_storage._M_storage[0x12] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
  local_f8._M_first._M_storage._M_storage[0x13] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
  local_f8._M_first._M_storage._M_storage[0] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
  local_f8._M_first._M_storage._M_storage[1] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
  local_f8._M_first._M_storage._M_storage[2] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
  local_f8._M_first._M_storage._M_storage[3] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
  local_f8._M_first._M_storage._M_storage[4] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
  local_f8._M_first._M_storage._M_storage[5] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
  local_f8._M_first._M_storage._M_storage[6] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
  local_f8._M_first._M_storage._M_storage[7] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
  local_f8._M_first._M_storage._M_storage[8] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
  local_f8._M_first._M_storage._M_storage[9] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
  local_f8._M_first._M_storage._M_storage[10] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
  local_f8._M_first._M_storage._M_storage[0xb] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
  local_f8._M_first._M_storage._M_storage[0xc] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
  local_f8._M_first._M_storage._M_storage[0xd] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
  local_f8._M_first._M_storage._M_storage[0xe] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
  local_f8._M_first._M_storage._M_storage[0xf] =
       local_12c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
  local_b0 = 2;
  GetScriptForDestination((CScript *)&local_118,(CTxDestination *)&local_f8._M_first);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (*(long *)&(__return_storage_ptr__->
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        )._M_impl.super__Vector_impl_data._M_start[1].vout.
                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data + 0x30),&local_118);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_118);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_f8._M_first);
  CTransaction::CTransaction
            ((CTransaction *)&local_f8._M_first,
             (__return_storage_ptr__->
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>)._M_impl.
             super__Vector_impl_data._M_start + 1);
  AddCoins(coinsRet,(CTransaction *)&local_f8._M_first,0,false);
  CTransaction::~CTransaction((CTransaction *)&local_f8._M_first);
  lVar3 = 0x38;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CMutableTransaction> SetupDummyInputs(FillableSigningProvider& keystoreRet, CCoinsViewCache& coinsRet, const std::array<CAmount,4>& nValues)
{
    std::vector<CMutableTransaction> dummyTransactions;
    dummyTransactions.resize(2);

    // Add some keys to the keystore:
    CKey key[4];
    for (int i = 0; i < 4; i++) {
        key[i].MakeNewKey(i % 2);
        keystoreRet.AddKey(key[i]);
    }

    // Create some dummy input transactions
    dummyTransactions[0].vout.resize(2);
    dummyTransactions[0].vout[0].nValue = nValues[0];
    dummyTransactions[0].vout[0].scriptPubKey << ToByteVector(key[0].GetPubKey()) << OP_CHECKSIG;
    dummyTransactions[0].vout[1].nValue = nValues[1];
    dummyTransactions[0].vout[1].scriptPubKey << ToByteVector(key[1].GetPubKey()) << OP_CHECKSIG;
    AddCoins(coinsRet, CTransaction(dummyTransactions[0]), 0);

    dummyTransactions[1].vout.resize(2);
    dummyTransactions[1].vout[0].nValue = nValues[2];
    dummyTransactions[1].vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[2].GetPubKey()));
    dummyTransactions[1].vout[1].nValue = nValues[3];
    dummyTransactions[1].vout[1].scriptPubKey = GetScriptForDestination(PKHash(key[3].GetPubKey()));
    AddCoins(coinsRet, CTransaction(dummyTransactions[1]), 0);

    return dummyTransactions;
}